

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-outputs.cc
# Opt level: O0

void basic_datatype_test_integral<unsigned_int,true>(string *name)

{
  string local_60;
  value_type_conflict7 local_30;
  value_type_conflict7 local_2c;
  undefined1 local_28 [4];
  int i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> v;
  string *name_local;
  
  v.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)name;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_28);
  for (local_2c = 0; (int)local_2c < 4; local_2c = local_2c + 1) {
    local_30 = local_2c;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_28,&local_30);
  }
  std::__cxx11::string::string((string *)&local_60,(string *)name);
  runtest_maybe_dobin<std::vector<unsigned_int,std::allocator<unsigned_int>>,true>
            (&local_60,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_28);
  std::__cxx11::string::~string((string *)&local_60);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_28);
  return;
}

Assistant:

void basic_datatype_test_integral(std::string name) {
    std::vector<T> v;
    for(int i=0; i<4; i++) {
        v.push_back(i);
    }
    runtest_maybe_dobin<std::vector<T>, DoBinary>(name, v);
}